

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int *arr;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  int n;
  char local_2d;
  int local_2c;
  
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  iVar1 = local_2c;
  lVar4 = (long)local_2c;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 4;
  }
  arr = (int *)operator_new__(uVar3);
  if (lVar4 < 1) {
    bubble_sort(arr,iVar1);
  }
  else {
    lVar4 = 0;
    piVar5 = arr;
    do {
      std::istream::operator>>((istream *)&std::cin,piVar5);
      iVar1 = local_2c;
      lVar4 = lVar4 + 1;
      piVar5 = piVar5 + 1;
    } while (lVar4 < local_2c);
    bubble_sort(arr,local_2c);
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[lVar4]);
        local_2d = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2d,1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_2c);
    }
  }
  operator_delete__(arr);
  return 0;
}

Assistant:

int main(){
    int n;
    cin >> n;
    int* arr = new int [n];
    for (int i = 0; i < n; i++) cin >> arr[i];
    bubble_sort(arr, n);
    for (int i = 0; i < n; i++) cout << arr[i] << ' ';
    delete[] arr;
    return 0;
}